

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int enum_ufs_prop(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  FPROP *pFVar4;
  size_t sVar5;
  bool bVar6;
  FINFO *local_1520;
  FINFO *lastp_1;
  FINFO *lastp;
  char *pp;
  char pext [255];
  char pname [255];
  char tver [16];
  char text [255];
  char tname [255];
  char namebuf [4096];
  undefined1 local_f0 [8];
  stat sbuf;
  DIR *dirp;
  size_t len;
  int rval;
  int n;
  FINFO *nextp;
  FINFO *prevp;
  dirent *dp;
  FINFO **finfo_buf_local;
  char *ver_local;
  char *name_local;
  char *dir_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  alarm(TIMEOUT_TIME);
  do {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sbuf.__glibc_reserved[2] = (__syscall_slong_t)opendir(dir);
    bVar6 = false;
    if ((DIR *)sbuf.__glibc_reserved[2] == (DIR *)0x0) {
      piVar2 = __errno_location();
      bVar6 = *piVar2 == 4;
    }
  } while (bVar6);
  alarm(0);
  if (sbuf.__glibc_reserved[2] == 0) {
    piVar2 = __errno_location();
    *Lisp_errno = *piVar2;
    dir_local._4_4_ = -1;
  }
  else {
    alarm(TIMEOUT_TIME);
    prevp = (FINFO *)readdir((DIR *)sbuf.__glibc_reserved[2]);
    alarm(0);
    nextp = (FINFO *)0x0;
    len._4_4_ = 0;
    while( true ) {
      bVar6 = true;
      if (prevp == (FINFO *)0x0) {
        piVar2 = __errno_location();
        bVar6 = *piVar2 == 4;
      }
      if (!bVar6) break;
      _rval = nextp;
      if ((((prevp != (FINFO *)0x0) && (iVar1 = strcmp(prevp->lname + 0xb,"."), iVar1 != 0)) &&
          (iVar1 = strcmp(prevp->lname + 0xb,".."), iVar1 != 0)) && (prevp->prop != (FPROP *)0x0)) {
        strcpy(text + 0xf8,prevp->lname + 0xb);
        strcpy(pext + 0xf8,name);
        separate_version(text + 0xf8,pname + 0xf8,0);
        pcVar3 = strrchr(text + 0xf8,0x2e);
        if (pcVar3 == (char *)0x0) {
          tver[8] = '\0';
        }
        else {
          *pcVar3 = '\0';
          strcpy(tver + 8,pcVar3 + 1);
        }
        pcVar3 = strrchr(pext + 0xf8,0x2e);
        if (pcVar3 == (char *)0x0) {
          pp._0_1_ = 0;
        }
        else {
          *pcVar3 = '\0';
          strcpy((char *)&pp,pcVar3 + 1);
        }
        iVar1 = match_pattern(text + 0xf8,pext + 0xf8);
        if (((iVar1 != 0) && (iVar1 = match_pattern(tver + 8,(char *)&pp), iVar1 != 0)) &&
           (iVar1 = match_pattern(pname + 0xf8,ver), iVar1 != 0)) {
          if (FreeFinfoList == (FINFO *)0x0) {
            _rval = (FINFO *)calloc(1,0x228);
            if (_rval == (FINFO *)0x0) {
              _rval = (FINFO *)0x0;
            }
            else {
              pFVar4 = (FPROP *)calloc(1,0x118);
              _rval->prop = pFVar4;
              if (pFVar4 == (FPROP *)0x0) {
                free(_rval);
                _rval = (FINFO *)0x0;
              }
            }
          }
          else {
            _rval = FreeFinfoList;
            FreeFinfoList = FreeFinfoList->next;
          }
          if (_rval == (FINFO *)0x0) {
            for (lastp_1 = nextp; lastp_1->next != (finfo *)0x0; lastp_1 = lastp_1->next) {
            }
            lastp_1->next = FreeFinfoList;
            FreeFinfoList = nextp;
            closedir((DIR *)sbuf.__glibc_reserved[2]);
            piVar2 = __errno_location();
            *Lisp_errno = *piVar2;
            return -1;
          }
          _rval->next = nextp;
          sprintf(tname + 0xf8,"%s/%s",dir,prevp->lname + 0xb);
          alarm(TIMEOUT_TIME);
          do {
            piVar2 = __errno_location();
            *piVar2 = 0;
            iVar1 = stat(tname + 0xf8,(stat *)local_f0);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar2 = __errno_location();
              bVar6 = *piVar2 == 4;
            }
          } while (bVar6);
          alarm(0);
          if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 2)) {
            for (local_1520 = _rval; local_1520->next != (finfo *)0x0; local_1520 = local_1520->next
                ) {
            }
            local_1520->next = FreeFinfoList;
            FreeFinfoList = _rval;
            closedir((DIR *)sbuf.__glibc_reserved[2]);
            piVar2 = __errno_location();
            *Lisp_errno = *piVar2;
            return -1;
          }
          strcpy(tname + 0xf8,prevp->lname + 0xb);
          if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
            _rval->dirp = 1;
            quote_dname(tname + 0xf8);
            strcpy(_rval->lname,tname + 0xf8);
            sVar5 = strlen(tname + 0xf8);
            _rval->lname[sVar5] = '>';
            _rval->lname[sVar5 + 1] = '\0';
            _rval->lname_len = sVar5 + 1;
          }
          else {
            _rval->dirp = 0;
            quote_fname_ufs(tname + 0xf8);
            sVar5 = strlen(tname + 0xf8);
            strcpy(_rval->lname,tname + 0xf8);
            _rval->lname[sVar5] = '\0';
            _rval->lname_len = sVar5;
          }
          strcpy(tname + 0xf8,prevp->lname + 0xb);
          strlen(tname + 0xf8);
          _rval->ino = sbuf.st_dev;
          _rval->prop->length = (uint)sbuf.st_rdev;
          _rval->prop->wdate = (int)sbuf.st_atim.tv_nsec + 0x1c94b00;
          _rval->prop->rdate = (int)sbuf.st_blocks + 0x1c94b00;
          _rval->prop->protect = (uint)sbuf.st_nlink;
          len._4_4_ = len._4_4_ + 1;
        }
      }
      piVar2 = __errno_location();
      *piVar2 = 0;
      alarm(TIMEOUT_TIME);
      prevp = (FINFO *)readdir((DIR *)sbuf.__glibc_reserved[2]);
      alarm(0);
      nextp = _rval;
    }
    closedir((DIR *)sbuf.__glibc_reserved[2]);
    if (0 < len._4_4_) {
      *finfo_buf = nextp;
    }
    dir_local._4_4_ = len._4_4_;
  }
  return dir_local._4_4_;
}

Assistant:

static int enum_ufs_prop(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  /* struct passwd *pwd; -- From author support */
  struct stat sbuf;
  char namebuf[MAXPATHLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP_Case((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname_ufs(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      nextp->ino = sbuf.st_ino;
      nextp->prop->length = (unsigned)sbuf.st_size;
      nextp->prop->wdate = (unsigned)ToLispTime(sbuf.st_mtime);
      nextp->prop->rdate = (unsigned)ToLispTime(sbuf.st_atime);
      nextp->prop->protect = (unsigned)sbuf.st_mode;
      /*
                      TIMEOUT(pwd = getpwuid(sbuf.st_uid));
                      if (pwd == (struct passwd *)NULL) {
                              nextp->prop->au_len = 0;
                      } else {
                              len = strlen(pwd->pw_name);
                              strcpy(nextp->prop->author, pwd->pw_name);
                              *(nextp->prop->author + len) = '\0';
                              nextp->prop->au_len = len;
                      }
      */
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}